

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O1

void __thiscall kj::std::anon_unknown_0::TestCase75::run(TestCase75 *this)

{
  Fault f;
  char buf [9];
  StdInputStream in;
  StdOutputStream out;
  stringstream ss;
  Maybe<kj::Exception> e;
  Fault local_350;
  undefined4 local_341;
  char acStack_33d [2];
  char local_33b;
  BufferedInputStream local_338;
  stringstream *local_330;
  ArrayOutputStream local_328;
  char (*local_308) [9];
  stringstream local_2f8 [16];
  uchar local_2e8 [112];
  ios_base local_278 [264];
  Maybe<kj::Exception> local_170;
  
  ::std::__cxx11::stringstream::stringstream(local_2f8);
  local_338.super_InputStream._vptr_InputStream = (InputStream)&PTR__BufferedInputStream_001c20c8;
  local_328.array.ptr = local_2e8;
  local_328.super_BufferedOutputStream.super_OutputStream._vptr_OutputStream =
       (OutputStream)&PTR__ArrayOutputStream_001c2110;
  local_330 = local_2f8;
  ::std::ostream::write((char *)local_328.array.ptr,0x18bf9e);
  local_328.array.size_ = (size_t)&PTR_run_001c2098;
  local_328.fillPos = (byte *)&local_338;
  local_308 = (char (*) [9])&local_341;
  _::runCatchingExceptions(&local_170,(Runnable *)&local_328.array.size_);
  local_33b = '\0';
  if (local_170.ptr.isSet != false) {
    if ((CONCAT21(acStack_33d,local_341._3_1_) != 0x726162 || local_341 != 0x626f6f66) &&
       (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[9]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
                 ,0x62,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
                 (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
                 (char (*) [7])"foobar",(char (*) [9])&local_341);
    }
    if (local_170.ptr.isSet == true) {
      Exception::~Exception(&local_170.ptr.field_1.value);
    }
    ArrayOutputStream::~ArrayOutputStream(&local_328);
    BufferedInputStream::~BufferedInputStream(&local_338);
    ::std::__cxx11::stringstream::~stringstream(local_2f8);
    ::std::ios_base::~ios_base(local_278);
    return;
  }
  local_350.exception = (Exception *)0x0;
  local_328.array.size_ = 0;
  local_328.fillPos = (byte *)0x0;
  _::Debug::Fault::init
            (&local_350,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
            );
  _::Debug::Fault::fatal(&local_350);
}

Assistant:

TEST(StdIoStream, ReadToEndOfFile) {
  // Check that read throws an exception when eof is reached before specified
  // bytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  const void* bytes = "foobar";

  out.write(bytes, 6);

  char buf[9];

  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    in.read(buf, 8, 8);
  });
  buf[6] = '\0';

  ASSERT_FALSE(e == nullptr);

  // Ensure that the value is still read up to the EOF.
  EXPECT_STREQ("foobar", buf);
}